

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O2

void __thiscall PatternBlock::PatternBlock(PatternBlock *this,PatternBlock *a,PatternBlock *b)

{
  int4 iVar1;
  PatternBlock *this_00;
  
  (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = intersect(a,b);
  iVar1 = this_00->nonzerosize;
  this->offset = this_00->offset;
  this->nonzerosize = iVar1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&this->maskvec,&this_00->maskvec);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&this->valvec,&this_00->valvec);
  ~PatternBlock(this_00);
  operator_delete(this_00);
  return;
}

Assistant:

PatternBlock::PatternBlock(const PatternBlock *a,const PatternBlock *b)

{				// Construct PatternBlock by ANDing two others together
  PatternBlock *res = a->intersect(b);
  offset = res->offset;
  nonzerosize = res->nonzerosize;
  maskvec = res->maskvec;
  valvec = res->valvec;
  delete res;
}